

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolNumIters(SUNLinearSolver S)

{
  long in_RDI;
  int ier;
  undefined4 local_c;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x48) == 0) {
    local_c = 0;
  }
  else {
    local_c = (**(code **)(*(long *)(in_RDI + 8) + 0x48))(in_RDI);
  }
  return local_c;
}

Assistant:

int SUNLinSolNumIters(SUNLinearSolver S)
{
  int ier;
  if (S->ops->numiters)
    ier = S->ops->numiters(S);
  else
    ier = 0;
  return(ier);
}